

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

void ktxHashList_Destruct(ktxHashList *pHead)

{
  void *pvVar1;
  uint uVar2;
  long lVar3;
  long *in_RDI;
  UT_hash_handle *_hd_hh_del;
  uint _hd_bkt;
  ktxKVListEntry *tmp;
  ktxKVListEntry *head;
  ktxKVListEntry *kv;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = (void *)*in_RDI;
  local_10 = local_18;
  while (local_10 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_10 + 0x30);
    if ((*(long *)((long)local_10 + 0x28) == 0) && (*(long *)((long)local_10 + 0x30) == 0)) {
      free((void *)**(undefined8 **)((long)local_18 + 0x20));
      free(*(void **)((long)local_18 + 0x20));
      local_18 = (void *)0x0;
    }
    else {
      if (local_10 ==
          (void *)(*(long *)(*(long *)((long)local_18 + 0x20) + 0x18) -
                  *(long *)(*(long *)((long)local_18 + 0x20) + 0x20))) {
        *(long *)(*(long *)((long)local_18 + 0x20) + 0x18) =
             *(long *)((long)local_10 + 0x28) + *(long *)(*(long *)((long)local_18 + 0x20) + 0x20);
      }
      if (*(long *)((long)local_10 + 0x28) == 0) {
        local_18 = *(void **)((long)local_10 + 0x30);
      }
      else {
        *(undefined8 *)
         (*(long *)((long)local_10 + 0x28) + 0x10 +
         *(long *)(*(long *)((long)local_18 + 0x20) + 0x20)) =
             *(undefined8 *)((long)local_10 + 0x30);
      }
      if (*(long *)((long)local_10 + 0x30) != 0) {
        *(undefined8 *)
         (*(long *)((long)local_10 + 0x30) + 8 + *(long *)(*(long *)((long)local_18 + 0x20) + 0x20))
             = *(undefined8 *)((long)local_10 + 0x28);
      }
      uVar2 = *(uint *)((long)local_10 + 0x54) & *(int *)(*(long *)((long)local_18 + 0x20) + 8) - 1U
      ;
      lVar3 = **(long **)((long)local_18 + 0x20) + (ulong)uVar2 * 0x10;
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + -1;
      if (*(long *)(**(long **)((long)local_18 + 0x20) + (ulong)uVar2 * 0x10) ==
          (long)local_10 + 0x20) {
        *(undefined8 *)(**(long **)((long)local_18 + 0x20) + (ulong)uVar2 * 0x10) =
             *(undefined8 *)((long)local_10 + 0x40);
      }
      if (*(long *)((long)local_10 + 0x38) != 0) {
        *(undefined8 *)(*(long *)((long)local_10 + 0x38) + 0x20) =
             *(undefined8 *)((long)local_10 + 0x40);
      }
      if (*(long *)((long)local_10 + 0x40) != 0) {
        *(undefined8 *)(*(long *)((long)local_10 + 0x40) + 0x18) =
             *(undefined8 *)((long)local_10 + 0x38);
      }
      *(int *)(*(long *)((long)local_18 + 0x20) + 0x10) =
           *(int *)(*(long *)((long)local_18 + 0x20) + 0x10) + -1;
    }
    free(local_10);
    local_10 = pvVar1;
  }
  return;
}

Assistant:

void
ktxHashList_Destruct(ktxHashList* pHead)
{
    ktxKVListEntry* kv;
    ktxKVListEntry* head = *pHead;

    for(kv = head; kv != NULL;) {
        ktxKVListEntry* tmp = (ktxKVListEntry*)kv->hh.next;
        HASH_DELETE(hh, head, kv);
        free(kv);
        kv = tmp;
    }
}